

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

bcf_hrec_t * bcf_hdr_get_hrec(bcf_hdr_t *hdr,int type,char *key,char *value,char *str_class)

{
  uint uVar1;
  bcf_hrec_t **ppbVar2;
  uint *puVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  bcf_hrec_t *unaff_R15;
  bcf_hrec_t *pbVar15;
  
  if (type == 5) {
    iVar12 = hdr->nhrec;
    if (0 < (long)iVar12) {
      ppbVar2 = hdr->hrec;
      lVar14 = 0;
      do {
        pbVar15 = ppbVar2[lVar14];
        if ((pbVar15->type == 5) && (iVar6 = strcmp(pbVar15->key,key), iVar6 == 0)) {
          if (value == (char *)0x0) {
            return pbVar15;
          }
          iVar6 = strcmp(pbVar15->value,value);
          if (iVar6 == 0) {
            return pbVar15;
          }
        }
        lVar14 = lVar14 + 1;
      } while (iVar12 != lVar14);
    }
  }
  else {
    if (type != 4) {
      puVar3 = (uint *)hdr->dict[type == 3];
      uVar7 = *puVar3;
      if (uVar7 == 0) {
        uVar8 = 0;
      }
      else {
        uVar13 = (uint)*value;
        if (*value == '\0') {
          uVar13 = 0;
        }
        else {
          cVar5 = value[1];
          if (cVar5 != '\0') {
            pcVar10 = value + 2;
            do {
              uVar13 = (int)cVar5 + uVar13 * 0x1f;
              cVar5 = *pcVar10;
              pcVar10 = pcVar10 + 1;
            } while (cVar5 != '\0');
          }
        }
        uVar13 = uVar13 & uVar7 - 1;
        lVar14 = *(long *)(puVar3 + 4);
        iVar12 = 1;
        uVar11 = uVar13;
        do {
          uVar1 = *(uint *)(lVar14 + (ulong)(uVar11 >> 4) * 4);
          bVar9 = (char)uVar11 * '\x02' & 0x1e;
          uVar8 = uVar1 >> bVar9;
          if (((uVar8 & 2) != 0) ||
             (((uVar8 & 1) == 0 &&
              (iVar6 = strcmp(*(char **)(*(long *)(puVar3 + 6) + (ulong)uVar11 * 8),value),
              iVar6 == 0)))) {
            uVar8 = uVar11;
            if ((uVar1 >> bVar9 & 3) != 0) {
              uVar8 = uVar7;
            }
            break;
          }
          uVar11 = uVar11 + iVar12 & uVar7 - 1;
          iVar12 = iVar12 + 1;
          uVar8 = uVar7;
        } while (uVar11 != uVar13);
      }
      if (uVar8 == uVar7) {
        return (bcf_hrec_t *)0x0;
      }
      iVar12 = 0;
      if (type != 3) {
        iVar12 = type;
      }
      return *(bcf_hrec_t **)((ulong)uVar8 * 0x30 + *(long *)(puVar3 + 8) + 0x10 + (long)iVar12 * 8)
      ;
    }
    iVar12 = hdr->nhrec;
    if (0 < (long)iVar12) {
      ppbVar2 = hdr->hrec;
      lVar14 = 0;
      do {
        pbVar15 = ppbVar2[lVar14];
        if ((pbVar15->type == 4) && (iVar6 = strcmp(pbVar15->key,str_class), iVar6 == 0)) {
          uVar7 = bcf_hrec_find_key(pbVar15,key);
          if (((int)uVar7 < 0) || (iVar6 = strcmp(pbVar15->vals[uVar7],value), iVar6 != 0)) {
            bVar4 = true;
            pbVar15 = unaff_R15;
          }
          else {
            bVar4 = false;
          }
          unaff_R15 = pbVar15;
          if (!bVar4) {
            return pbVar15;
          }
        }
        lVar14 = lVar14 + 1;
      } while (iVar12 != lVar14);
    }
  }
  return (bcf_hrec_t *)0x0;
}

Assistant:

bcf_hrec_t *bcf_hdr_get_hrec(const bcf_hdr_t *hdr, int type, const char *key, const char *value, const char *str_class)
{
    int i;
    if ( type==BCF_HL_GEN )
    {
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=type ) continue;
            if ( strcmp(hdr->hrec[i]->key,key) ) continue;
            if ( !value || !strcmp(hdr->hrec[i]->value,value) ) return hdr->hrec[i];
        }
        return NULL;
    }
    else if ( type==BCF_HL_STR )
    {
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=type ) continue;
            if ( strcmp(hdr->hrec[i]->key,str_class) ) continue;
            int j = bcf_hrec_find_key(hdr->hrec[i],key);
            if ( j>=0 && !strcmp(hdr->hrec[i]->vals[j],value) ) return hdr->hrec[i];
        }
        return NULL;
    }
    vdict_t *d = type==BCF_HL_CTG ? (vdict_t*)hdr->dict[BCF_DT_CTG] : (vdict_t*)hdr->dict[BCF_DT_ID];
    khint_t k = kh_get(vdict, d, value);
    if ( k == kh_end(d) ) return NULL;
    return kh_val(d, k).hrec[type==BCF_HL_CTG?0:type];
}